

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O0

int comex_group_free(comex_group_t id)

{
  int in_EDI;
  comex_igroup_t *previous_group_list_item;
  comex_igroup_t *current_group_list_item;
  comex_igroup_t *local_18;
  comex_igroup_t *igroup;
  
  local_18 = (comex_igroup_t *)0x0;
  for (igroup = group_list; (igroup != (comex_igroup_t *)0x0 && (igroup->id != in_EDI));
      igroup = igroup->next) {
    local_18 = igroup;
  }
  if (igroup == (comex_igroup_t *)0x0) {
    __assert_fail("current_group_list_item != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/groups.c"
                  ,0xaf,"int comex_group_free(comex_group_t)");
  }
  if (local_18 != (comex_igroup_t *)0x0) {
    local_18->next = igroup->next;
  }
  comex_igroup_finalize(igroup);
  free(igroup);
  return 0;
}

Assistant:

int comex_group_free(comex_group_t id)
{
    comex_igroup_t *current_group_list_item = group_list;
    comex_igroup_t *previous_group_list_item = NULL;

    /* find the group to free */
    while (current_group_list_item != NULL) {
        if (current_group_list_item->id == id) {
            break;
        }
        previous_group_list_item = current_group_list_item;
        current_group_list_item = current_group_list_item->next;
    }
    /* make sure we found a group */
    assert(current_group_list_item != NULL);
    /* remove the group from the linked list */
    if (previous_group_list_item != NULL) {
        previous_group_list_item->next = current_group_list_item->next;
    }
    /* free the group */
    comex_igroup_finalize(current_group_list_item);
    free(current_group_list_item);

    return COMEX_SUCCESS;
}